

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

void expression_eval(FILE *out,char *valueIn,_Bool returnString)

{
  int iVar1;
  pattern_match_t *matches_00;
  FILE *out_00;
  pattern_match_t *ppVar2;
  char *in_RSI;
  pattern_analyse_t *in_RDI;
  pattern_match_t *matches;
  char *expr;
  char *dup;
  char *tmp;
  pattern_analyse_t analysation;
  pattern_analyse_t *analysation_00;
  
  iVar1 = strncmp(in_RSI,"${",2);
  if (iVar1 == 0) {
    matches_00 = (pattern_match_t *)strdup(in_RSI);
    analysation_00 = (pattern_analyse_t *)((long)&matches_00->string + 2);
    out_00 = (FILE *)strchr((char *)analysation_00,0x7d);
    *(char *)&out_00->_flags = '\0';
    ppVar2 = expression_extract(in_RDI,in_RSI);
    builder_generateCode(out_00,matches_00,analysation_00,SUB81((ulong)ppVar2 >> 0x38,0));
    free(matches_00);
    expression_free((pattern_match_t *)0x105d38);
  }
  return;
}

Assistant:

void expression_eval(FILE *out, char *valueIn, bool returnString) {
	pattern_analyse_t analysation;
	analysation.hasEquation = false;
	analysation.hasFloat = false;
	analysation.hasInt = false;
	analysation.hasOperator = false;
	analysation.hasString = false;
	analysation.hasVariable = false;

	char *tmp;
	if ( !strncmp(valueIn, "${", 2) ) {
		char *dup = strdup(valueIn);
		char *expr = dup;
		expr += 2;
		tmp = strchr(expr, '}');
		*tmp = '\0';

		pattern_match_t *matches = expression_extract(&analysation, expr);
		builder_generateCode(out, matches, &analysation, returnString);

		free(dup);
		expression_free(matches);
	}
}